

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  unsigned_short *puVar1;
  FuncState *fs;
  int iVar2;
  BinOpr BVar3;
  ushort uVar4;
  BinOpr op;
  UnOpr op_00;
  expdesc v2;
  expdesc local_48;
  
  fs = ls->fs;
  uVar4 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar4;
  if (200 < uVar4) {
    errorlimit(fs,200,"C levels");
  }
  iVar2 = (ls->t).token;
  if (iVar2 < 0x114) {
    if (0x106 < iVar2) {
      switch(iVar2) {
      case 0x107:
        v->t = -1;
        v->f = -1;
        v->k = VFALSE;
        break;
      default:
        goto switchD_0010e35e_caseD_108;
      case 0x109:
        luaX_next(ls);
        body(ls,v,0,ls->linenumber);
        goto LAB_0010e4fd;
      case 0x10e:
        v->t = -1;
        v->f = -1;
        v->k = VNIL;
        break;
      case 0x10f:
        op_00 = OPR_NOT;
        goto LAB_0010e4bd;
      }
LAB_0010e47b:
      (v->u).info = 0;
      goto LAB_0010e4a8;
    }
    if (iVar2 == 0x23) {
      op_00 = OPR_LEN;
    }
    else {
      if (iVar2 != 0x2d) {
        if (iVar2 != 0x7b) goto switchD_0010e35e_caseD_108;
        constructor(ls,v);
        goto LAB_0010e4fd;
      }
      op_00 = OPR_MINUS;
    }
LAB_0010e4bd:
    iVar2 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,8);
    luaK_prefix(ls->fs,op_00,v,iVar2);
  }
  else {
    if (iVar2 < 0x11f) {
      if (iVar2 == 0x114) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_0010e47b;
      }
      if (iVar2 != 0x118) goto switchD_0010e35e_caseD_108;
      if (fs->f->is_vararg == '\0') {
        luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
      }
      iVar2 = luaK_codeABC(fs,OP_VARARG,0,1,0);
      v->t = -1;
      v->f = -1;
      v->k = VVARARG;
LAB_0010e426:
      (v->u).info = iVar2;
    }
    else {
      if (iVar2 != 0x11f) {
        if (iVar2 == 0x121) {
          iVar2 = luaK_stringK(fs,(ls->t).seminfo.ts);
          v->t = -1;
          v->f = -1;
          v->k = VK;
          goto LAB_0010e426;
        }
switchD_0010e35e_caseD_108:
        suffixedexp(ls,v);
        goto LAB_0010e4fd;
      }
      v->t = -1;
      v->f = -1;
      v->k = VKNUM;
      (v->u).info = 0;
      v->u = *(anon_union_8_3_d9ba1464_for_u *)&(ls->t).seminfo;
    }
LAB_0010e4a8:
    luaX_next(ls);
  }
LAB_0010e4fd:
  iVar2 = (ls->t).token;
  op = OPR_NOBINOPR;
  if (iVar2 < 0x5e) {
    switch(iVar2) {
    case 0x25:
      op = OPR_MOD;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
      goto switchD_0010e521_caseD_26;
    case 0x2a:
      op = OPR_MUL;
      break;
    case 0x2b:
      op = OPR_ADD;
      break;
    case 0x2d:
      op = OPR_SUB;
      break;
    case 0x2f:
      op = OPR_DIV;
      break;
    default:
      if (iVar2 == 0x3c) {
        op = OPR_LT;
      }
      else {
        if (iVar2 != 0x3e) goto switchD_0010e521_caseD_26;
        op = OPR_GT;
      }
    }
  }
  else {
    switch(iVar2) {
    case 0x110:
      op = OPR_OR;
      break;
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x118:
      goto switchD_0010e521_caseD_26;
    case 0x117:
      op = OPR_CONCAT;
      break;
    case 0x119:
      op = OPR_EQ;
      break;
    case 0x11a:
      op = OPR_GE;
      break;
    case 0x11b:
      op = OPR_LE;
      break;
    case 0x11c:
      op = OPR_NE;
      break;
    default:
      if (iVar2 == 0x5e) {
        op = OPR_POW;
      }
      else {
        if (iVar2 != 0x101) goto switchD_0010e521_caseD_26;
        op = OPR_AND;
      }
    }
  }
  do {
    if ((int)(uint)priority[op].left <= limit) goto switchD_0010e521_caseD_26;
    iVar2 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,op,v);
    BVar3 = subexpr(ls,&local_48,(uint)priority[op].right);
    luaK_posfix(ls->fs,op,v,&local_48,iVar2);
    op = BVar3;
  } while (BVar3 != OPR_NOBINOPR);
  op = OPR_NOBINOPR;
switchD_0010e521_caseD_26:
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    int line = ls->linenumber;
    luaX_next(ls);
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line);
  }
  else simpleexp(ls, v);
  /* expand while operators have priorities higher than `limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2;
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    luaK_posfix(ls->fs, op, v, &v2, line);
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}